

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::Read
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
           *this)

{
  VarBoundHandler<TestNLHandler3> *in_RDI;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  reader;
  BinaryReader<mp::internal::EndiannessConverter> bound_reader;
  VarBoundHandler<TestNLHandler3> bound_handler;
  BinaryReader<mp::internal::EndiannessConverter> *in_stack_ffffffffffffff68;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
  local_88;
  BinaryReader<mp::internal::EndiannessConverter> local_58;
  VarBoundHandler<TestNLHandler3> local_18;
  
  if (((ulong)in_RDI[1].handler_ & 1) == 0) {
    Read((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity,
         (BinaryReader<mp::internal::EndiannessConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
  }
  else {
    VarBoundHandler<TestNLHandler3>::VarBoundHandler
              (in_RDI,(TestNLHandler3 *)in_stack_ffffffffffffff68);
    BinaryReader<mp::internal::EndiannessConverter>::BinaryReader
              ((BinaryReader<mp::internal::EndiannessConverter> *)in_RDI,in_stack_ffffffffffffff68);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
    ::NLReader(&local_88,&local_58,(NLHeader *)in_RDI->handler_,&local_18,
               *(int *)&in_RDI[1].handler_);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
    ::Read((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
            *)bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2.
              _M_allocated_capacity,
           (BinaryReader<mp::internal::EndiannessConverter> *)
           bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
    Read((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity,
         (BinaryReader<mp::internal::EndiannessConverter> *)
         bound_reader.super_BinaryReaderBase.super_ReaderBase.name_._M_string_length);
    BinaryReader<mp::internal::EndiannessConverter>::~BinaryReader
              ((BinaryReader<mp::internal::EndiannessConverter> *)0x255016);
    VarBoundHandler<TestNLHandler3>::~VarBoundHandler((VarBoundHandler<TestNLHandler3> *)0x255023);
  }
  NLHandler<TestNLHandler3,_int>::EndInput
            ((NLHandler<TestNLHandler3,_int> *)
             in_RDI[1].super_NullNLHandler<int>.super_NLHandler<mp::NullNLHandler<int>,_int>.
             _vptr_NLHandler);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}